

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

int formparse(Configurable *config,char *input,curl_httppost **httppost,curl_httppost **last_post,
             _Bool literal_value)

{
  curl_httppost **ppcVar1;
  curl_httppost **ppcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ushort **ppuVar7;
  size_t sVar8;
  size_t sVar9;
  multi_files *pmVar10;
  char *pcVar11;
  void *__ptr;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  char cVar15;
  char *pcVar16;
  multi_files **multi_first;
  uint uVar17;
  bool bVar18;
  multi_files *multi_start;
  char *local_268;
  multi_files *multi_current;
  curl_httppost **local_258;
  curl_httppost **local_250;
  char *local_248;
  char *local_240;
  char type_major [128];
  char type_minor [128];
  char name [256];
  
  iVar3 = __isoc99_sscanf(input,"%255[^=]=",name);
  if ((iVar3 != 1) || (pcVar5 = strchr(input,0x3d), pcVar5 == (char *)0x0)) {
    warnf(config,"Illegally formatted input field!\n");
    return 1;
  }
  pcVar5 = strdup(pcVar5 + 1);
  if (pcVar5 == (char *)0x0) {
    curl_mfprintf(config->errors,"out of memory\n");
    return 1;
  }
  cVar15 = *pcVar5;
  if (cVar15 != '@' || literal_value) {
    type_major._8_8_ = name;
    if (literal_value) {
      iVar3 = 1;
    }
    else {
      pcVar11 = strstr(pcVar5,";type=");
      type_major[0] = '\x01';
      type_major[1] = '\0';
      type_major[2] = '\0';
      type_major[3] = '\0';
      if (pcVar11 == (char *)0x0) {
        iVar3 = 1;
      }
      else {
        type_major[0x10] = '\x0e';
        type_major[0x11] = '\0';
        type_major[0x12] = '\0';
        type_major[0x13] = '\0';
        type_major._24_8_ = pcVar11 + 6;
        *pcVar11 = '\0';
        cVar15 = *pcVar5;
        iVar3 = 2;
      }
      if (cVar15 == '<' && !literal_value) {
        uVar13 = (ulong)(uint)(iVar3 << 4);
        pcVar11 = type_major + uVar13;
        pcVar11[0] = '\a';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        *(char **)(type_major + uVar13 + 8) = pcVar5 + 1;
        pcVar11 = type_major + uVar13 + 0x10;
        pcVar11[0] = '\x11';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        iVar3 = curl_formadd(httppost,last_post,8,type_major,0x11);
        if (iVar3 == 0) goto LAB_0010937b;
        warnf(config,"curl_formadd failed, possibly the file %s is bad!\n",pcVar5 + 1);
        iVar3 = 6;
        goto LAB_00109322;
      }
    }
    type_major[0] = '\x01';
    type_major[1] = '\0';
    type_major[2] = '\0';
    type_major[3] = '\0';
    uVar13 = (ulong)(uint)(iVar3 << 4);
    pcVar11 = type_major + uVar13;
    pcVar11[0] = '\x04';
    pcVar11[1] = '\0';
    pcVar11[2] = '\0';
    pcVar11[3] = '\0';
    *(char **)(type_major + uVar13 + 8) = pcVar5;
    pcVar11 = type_major + uVar13 + 0x10;
    pcVar11[0] = '\x11';
    pcVar11[1] = '\0';
    pcVar11[2] = '\0';
    pcVar11[3] = '\0';
    iVar3 = 8;
    iVar4 = curl_formadd(httppost,last_post,8,type_major,0x11);
    if (iVar4 != 0) {
      warnf(config,"curl_formadd failed!\n");
LAB_00109322:
      free(pcVar5);
      return iVar3;
    }
  }
  else {
    multi_start = (multi_files *)0x0;
    multi_current = (multi_files *)0x0;
    pcVar11 = pcVar5 + 1;
    local_268 = pcVar5;
    local_258 = httppost;
    local_250 = last_post;
    do {
      pcVar6 = strchr(pcVar11,0x3b);
      local_240 = pcVar11;
      pcVar11 = strchr(pcVar11,0x2c);
      pcVar5 = pcVar6;
      if (pcVar11 < pcVar6) {
        pcVar5 = pcVar11;
      }
      if (pcVar11 == (char *)0x0) {
        pcVar5 = pcVar6;
      }
      if (pcVar5 != (char *)0x0) {
        bVar18 = *pcVar5 == ';';
        pcVar14 = (char *)0x0;
        pcVar6 = (char *)0x0;
LAB_00108f4c:
        do {
          *pcVar5 = '\0';
          pcVar11 = pcVar5 + 1;
          do {
            while( true ) {
              if (((!bVar18) || (pcVar11 == (char *)0x0)) || (*pcVar11 == ',')) goto LAB_001090e1;
              ppuVar7 = __ctype_b_loc();
              pcVar11 = pcVar11 + -1;
              do {
                pcVar16 = pcVar11;
                pcVar11 = pcVar16 + 1;
              } while ((*(byte *)((long)*ppuVar7 + (ulong)(byte)pcVar16[1] * 2 + 1) & 0x20) != 0);
              iVar3 = Curl_raw_nequal("type=",pcVar11,5);
              if (iVar3 == 0) break;
              local_248 = pcVar16 + 6;
              iVar3 = __isoc99_sscanf(local_248,"%127[^/]/%127[^;,\n]",type_major,type_minor);
              if (iVar3 != 2) {
                warnf(config,"Illegally formatted content-type field!\n");
                free(local_268);
                FreeMultiInfo(&multi_start,&multi_current);
                return 2;
              }
              sVar8 = strlen(type_major);
              sVar9 = strlen(type_minor);
              lVar12 = sVar9 + sVar8;
              pcVar14 = pcVar11 + lVar12 + 6;
              cVar15 = *pcVar14;
              bVar18 = cVar15 == ';';
              pcVar5 = pcVar14;
              if (bVar18) {
                iVar3 = Curl_raw_nequal(";filename=",pcVar14,10);
                if ((iVar3 == 0) &&
                   (pcVar5 = strchr(pcVar11 + lVar12 + 7,0x3b), pcVar5 == (char *)0x0)) {
                  sVar8 = strlen(pcVar14);
                  pcVar5 = pcVar11 + sVar8 + lVar12 + 6;
                }
                cVar15 = *pcVar5;
              }
              pcVar11 = (char *)0x0;
              pcVar14 = local_248;
              if (cVar15 != '\0') {
                pcVar14 = pcVar16 + 6;
                goto LAB_00108f4c;
              }
            }
            iVar3 = Curl_raw_nequal("filename=",pcVar11,9);
            if (iVar3 == 0) goto LAB_001090e1;
            pcVar6 = pcVar16 + 10;
            pcVar5 = strchr(pcVar6,0x3b);
            if (pcVar5 != (char *)0x0) break;
            pcVar5 = strchr(pcVar6,0x2c);
            bVar18 = true;
            pcVar11 = (char *)0x0;
          } while (pcVar5 == (char *)0x0);
          pcVar6 = pcVar16 + 10;
          bVar18 = true;
        } while( true );
      }
      pcVar14 = (char *)0x0;
      pcVar11 = (char *)0x0;
      pcVar6 = (char *)0x0;
LAB_001090e1:
      multi_first = &multi_start;
      pmVar10 = AddMultiFiles(local_240,pcVar14,pcVar6,multi_first,&multi_current);
      ppcVar2 = local_250;
      ppcVar1 = local_258;
      if (pmVar10 == (multi_files *)0x0) {
        warnf(config,"Error building form post!\n");
        free(local_268);
        FreeMultiInfo(&multi_start,&multi_current);
        return 3;
      }
    } while ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0'));
    pcVar5 = local_268;
    if (multi_start != (multi_files *)0x0) {
      uVar17 = 0;
      for (pmVar10 = multi_start; pmVar10 != (multi_files *)0x0; pmVar10 = pmVar10->next) {
        uVar17 = uVar17 + 1;
      }
      __ptr = malloc((ulong)(uVar17 + 1) << 4);
      if (__ptr == (void *)0x0) {
        curl_mfprintf(config->errors,"Error building form post!\n");
        free(local_268);
        FreeMultiInfo(&multi_start,&multi_current);
        return 4;
      }
      for (lVar12 = 0; (ulong)uVar17 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        pmVar10 = *multi_first;
        *(CURLformoption *)((long)__ptr + lVar12) = (pmVar10->form).option;
        *(char **)((long)__ptr + lVar12 + 8) = (pmVar10->form).value;
        multi_first = &pmVar10->next;
      }
      *(undefined4 *)((long)__ptr + (ulong)uVar17 * 0x10) = 0x11;
      FreeMultiInfo(&multi_start,&multi_current);
      iVar3 = curl_formadd(ppcVar1,ppcVar2,1,name,8,__ptr,0x11);
      if (iVar3 != 0) {
        warnf(config,"curl_formadd failed!\n");
        free(__ptr);
        free(local_268);
        return 5;
      }
      free(__ptr);
      pcVar5 = local_268;
    }
  }
LAB_0010937b:
  free(pcVar5);
  return 0;
}

Assistant:

int formparse(struct Configurable *config,
              const char *input,
              struct curl_httppost **httppost,
              struct curl_httppost **last_post,
              bool literal_value)
{
  /* nextarg MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char name[256];
  char *contents = NULL;
  char type_major[128];
  char type_minor[128];
  char *contp;
  const char *type = NULL;
  char *sep;
  char *sep2;

  if((1 == sscanf(input, "%255[^=]=", name)) &&
     ((contp = strchr(input, '=')) != NULL)) {
    /* the input was using the correct format */

    /* Allocate the contents */
    contents = strdup(contp+1);
    if(!contents) {
      fprintf(config->errors, "out of memory\n");
      return 1;
    }
    contp = contents;

    if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      struct multi_files *multi_start = NULL;
      struct multi_files *multi_current = NULL;

      contp++;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        char *ptr;
        char *filename = NULL;

        sep = strchr(contp, ';');
        sep2 = strchr(contp, ',');

        /* pick the closest */
        if(sep2 && (sep2 < sep)) {
          sep = sep2;

          /* no type was specified! */
        }

        type = NULL;

        if(sep) {
          bool semicolon = (';' == *sep) ? TRUE : FALSE;

          *sep = '\0'; /* terminate file name at separator */

          ptr = sep+1; /* point to the text following the separator */

          while(semicolon && ptr && (','!= *ptr)) {

            /* pass all white spaces */
            while(ISSPACE(*ptr))
              ptr++;

            if(checkprefix("type=", ptr)) {
              /* set type pointer */
              type = &ptr[5];

              /* verify that this is a fine type specifier */
              if(2 != sscanf(type, "%127[^/]/%127[^;,\n]",
                             type_major, type_minor)) {
                warnf(config, "Illegally formatted content-type field!\n");
                Curl_safefree(contents);
                FreeMultiInfo(&multi_start, &multi_current);
                return 2; /* illegal content-type syntax! */
              }

              /* now point beyond the content-type specifier */
              sep = (char *)type + strlen(type_major)+strlen(type_minor)+1;

              /* there's a semicolon following - we check if it is a filename
                 specified and if not we simply assume that it is text that
                 the user wants included in the type and include that too up
                 to the next zero or semicolon. */
              if(*sep==';') {
                if(!checkprefix(";filename=", sep)) {
                  sep2 = strchr(sep+1, ';');
                  if(sep2)
                    sep = sep2;
                  else
                    sep = sep + strlen(sep); /* point to end of string */
                }
              }
              else
                semicolon = FALSE;

              if(*sep) {
                *sep = '\0'; /* zero terminate type string */

                ptr = sep+1;
              }
              else
                ptr = NULL; /* end */
            }
            else if(checkprefix("filename=", ptr)) {
              filename = &ptr[9];
              ptr = strchr(filename, ';');
              if(!ptr) {
                ptr = strchr(filename, ',');
              }
              if(ptr) {
                *ptr = '\0'; /* zero terminate */
                ptr++;
              }
            }
            else
              /* confusion, bail out of loop */
              break;
          }

          sep = ptr;
        }

        /* if type == NULL curl_formadd takes care of the problem */

        if(!AddMultiFiles(contp, type, filename, &multi_start,
                          &multi_current)) {
          warnf(config, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 3;
        }
        contp = sep; /* move the contents pointer to after the separator */

      } while(sep && *sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(multi_start) {
        struct curl_forms *forms = NULL;
        struct multi_files *ptr = multi_start;
        unsigned int i, count = 0;
        while(ptr) {
          ptr = ptr->next;
          ++count;
        }
        forms = malloc((count+1)*sizeof(struct curl_forms));
        if(!forms) {
          fprintf(config->errors, "Error building form post!\n");
          Curl_safefree(contents);
          FreeMultiInfo(&multi_start, &multi_current);
          return 4;
        }
        for(i = 0, ptr = multi_start; i < count; ++i, ptr = ptr->next) {
          forms[i].option = ptr->form.option;
          forms[i].value = ptr->form.value;
        }
        forms[count].option = CURLFORM_END;
        FreeMultiInfo(&multi_start, &multi_current);
        if(curl_formadd(httppost, last_post,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_ARRAY, forms, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(forms);
          Curl_safefree(contents);
          return 5;
        }
        Curl_safefree(forms);
      }
    }
    else {
      struct curl_forms info[4];
      int i = 0;
      char *ct = literal_value ? NULL : strstr(contp, ";type=");

      info[i].option = CURLFORM_COPYNAME;
      info[i].value = name;
      i++;

      if(ct) {
        info[i].option = CURLFORM_CONTENTTYPE;
        info[i].value = &ct[6];
        i++;
        ct[0] = '\0'; /* zero terminate here */
      }

      if(contp[0]=='<' && !literal_value) {
        info[i].option = CURLFORM_FILECONTENT;
        info[i].value = contp+1;
        i++;
        info[i].option = CURLFORM_END;

        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END ) != 0) {
          warnf(config, "curl_formadd failed, possibly the file %s is bad!\n",
                contp+1);
          Curl_safefree(contents);
          return 6;
        }
      }
      else {
#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(contp, strlen(contp))) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 7;
        }
#endif
        info[i].option = CURLFORM_COPYCONTENTS;
        info[i].value = contp;
        i++;
        info[i].option = CURLFORM_END;
        if(curl_formadd(httppost, last_post,
                        CURLFORM_ARRAY, info, CURLFORM_END) != 0) {
          warnf(config, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 8;
        }
      }
    }

  }
  else {
    warnf(config, "Illegally formatted input field!\n");
    return 1;
  }
  Curl_safefree(contents);
  return 0;
}